

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void notch::core::Init::normalXavier
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int n_in,int param_4)

{
  float *pfVar1;
  float *pfVar2;
  result_type_conflict1 rVar3;
  normal_distribution<float> nd;
  undefined4 local_30;
  float local_2c;
  undefined4 local_28;
  undefined1 local_24;
  
  if (n_in < 1) {
    local_2c = 1.0;
  }
  else {
    local_2c = SQRT(1.0 / (float)n_in);
  }
  local_30 = 0;
  local_28 = 0;
  local_24 = 0;
  pfVar2 = weights->_M_data;
  pfVar1 = pfVar2 + weights->_M_size;
  if (weights->_M_size == 0) {
    pfVar1 = (float *)0x0;
    pfVar2 = (float *)0x0;
  }
  if (pfVar2 != pfVar1) {
    do {
      rVar3 = ::std::normal_distribution<float>::operator()
                        (&local_30,
                         (rng->_M_t).
                         super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                         .
                         super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                         ._M_head_impl,(param_type *)&local_30);
      *pfVar2 = rVar3;
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != pfVar1);
  }
  return;
}

Assistant:

static
    void normalXavier(std::unique_ptr<RNG> &rng, Array &weights, int n_in, int) {
        float sigma = n_in > 0 ? sqrt(1.0 / n_in) : 1.0;
        std::normal_distribution<float> nd(0.0, sigma);
        std::generate(std::begin(weights), std::end(weights), [&nd, &rng] {
            float w = nd(*rng.get());
            return w;
        });
    }